

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O3

void __thiscall
adios2::format::ChunkV::CopyDataToBuffer
          (ChunkV *this,size_t size,void *buf,size_t pos,MemorySpace MemSpace)

{
  memcpy(this->m_TailChunk->Ptr + pos,buf,size);
  return;
}

Assistant:

void ChunkV::CopyDataToBuffer(const size_t size, const void *buf, size_t pos, MemorySpace MemSpace)
{
#ifdef ADIOS2_HAVE_GPU_SUPPORT
    if (MemSpace == MemorySpace::GPU)
    {
        helper::CopyFromGPUToBuffer(m_TailChunk->Ptr, pos, buf, MemSpace, size);
        return;
    }
#endif
    memcpy(m_TailChunk->Ptr + pos, buf, size);
}